

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  Name target;
  string_view table;
  CallRef *curr_00;
  bool bVar1;
  Module *pMVar2;
  Call *pCVar3;
  ExpressionList *args;
  CallIndirect *rep;
  PassOptions *passOptions;
  Expression *pEVar4;
  Drop *left;
  Expression **ppEVar5;
  Function *pFVar6;
  LocalGet *get_00;
  Block *pBVar7;
  PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_> *this_00;
  anon_class_1_0_00000001 local_1a9;
  function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
  local_1a8;
  Expression *local_188;
  Expression *calls;
  size_t local_178;
  char *local_170;
  Drop *local_168;
  Expression *local_160;
  Expression *local_158;
  initializer_list<wasm::Expression_*> local_150;
  uintptr_t local_140;
  Expression *local_138;
  Expression *get_1;
  Drop *drop;
  LocalSet *set;
  uintptr_t local_118;
  uintptr_t local_110;
  Index local_104;
  uintptr_t uStack_100;
  Index tempLocal;
  BasicType local_f4;
  Type local_f0;
  Type lastOperandType;
  Expression *lastOperand;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_c8;
  size_t local_a8;
  char *pcStack_a0;
  Builder local_98;
  Builder builder;
  HeapType local_88;
  RefFunc *local_80;
  RefFunc *ref_1;
  HeapType HStack_70;
  FeatureSet features;
  Builder local_58;
  TableGet *local_50;
  TableGet *get;
  size_t local_40;
  char *local_38;
  Builder local_30;
  RefFunc *local_28;
  RefFunc *ref;
  CallRef *local_18;
  CallRef *curr_local;
  OptimizeInstructions *this_local;
  
  local_18 = curr;
  curr_local = (CallRef *)this;
  skipNonNullCast(this,&curr->target,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)local_18,&local_18->target);
  if (!bVar1) {
    ref._4_4_ = 1;
    bVar1 = wasm::Type::operator==(&local_18->target->type,(BasicType *)((long)&ref + 4));
    if (!bVar1) {
      local_28 = Expression::dynCast<wasm::RefFunc>(local_18->target);
      if (local_28 == (RefFunc *)0x0) {
        local_50 = Expression::dynCast<wasm::TableGet>(local_18->target);
        if (local_50 == (TableGet *)0x0) {
          pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          ref_1._4_4_ = (pMVar2->features).features;
          pEVar4 = local_18->target;
          passOptions = Pass::getPassOptions((Pass *)this);
          pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          pEVar4 = Properties::getFallthrough(pEVar4,passOptions,pMVar2,AllowTeeBrIf);
          local_80 = Expression::dynCast<wasm::RefFunc>(pEVar4);
          curr_00 = local_18;
          if (local_80 == (RefFunc *)0x0) {
            std::
            function<std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>(wasm::Expression*)>
            ::
            function<wasm::OptimizeInstructions::visitCallRef(wasm::CallRef*)::_lambda(wasm::Expression*)_1_,void>
                      ((function<std::variant<wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>(wasm::Expression*)>
                        *)&local_1a8,&local_1a9);
            this_00 = &(this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
            ;
            pFVar6 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     ::getFunction(&this_00->
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  );
            pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                     ::getModule(&this_00->
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                );
            pEVar4 = CallUtils::convertToDirectCalls<wasm::CallRef>
                               (curr_00,&local_1a8,pFVar6,pMVar2);
            std::
            function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
            ::~function(&local_1a8);
            if (pEVar4 != (Expression *)0x0) {
              local_188 = pEVar4;
              replaceCurrent(this,pEVar4);
            }
          }
          else {
            local_88 = wasm::Type::getHeapType(&local_18->target->type);
            builder.wasm = (Module *)
                           wasm::Type::getHeapType
                                     (&(local_80->super_SpecificExpression<(wasm::Expression::Id)43>
                                       ).super_Expression.type);
            bVar1 = HeapType::operator!=(&local_88,(HeapType *)&builder);
            if (!bVar1) {
              pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       ::getModule(&(this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  );
              Builder::Builder(&local_98,pMVar2);
              bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                                (&(local_18->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (bVar1) {
                left = Builder::makeDrop(&local_98,local_18->target);
                local_a8 = (local_80->func).super_IString.str._M_len;
                pcStack_a0 = (local_80->func).super_IString.str._M_str;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                          (&local_c8);
                target.super_IString.str._M_str = pcStack_a0;
                target.super_IString.str._M_len = local_a8;
                pCVar3 = Builder::makeCall(&local_98,target,&local_c8,
                                           (Type)(local_18->
                                                 super_SpecificExpression<(wasm::Expression::Id)56>)
                                                 .super_Expression.type.id,
                                           (bool)(local_18->isReturn & 1));
                pBVar7 = Builder::makeSequence(&local_98,(Expression *)left,(Expression *)pCVar3);
                replaceCurrent(this,(Expression *)pBVar7);
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                          (&local_c8);
              }
              else {
                ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                    (&(local_18->operands).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    );
                lastOperandType.id = (uintptr_t)*ppEVar5;
                local_f0.id = (((Expression *)lastOperandType.id)->type).id;
                local_f4 = unreachable;
                bVar1 = wasm::Type::operator==(&local_f0,&local_f4);
                if (!bVar1) {
                  uStack_100 = local_f0.id;
                  bVar1 = TypeUpdating::canHandleAsLocal(local_f0);
                  if (bVar1) {
                    pFVar6 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             ::getFunction(&(this->
                                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                            ).
                                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                            .
                                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          );
                    local_118 = local_f0.id;
                    set._4_4_ = ref_1._4_4_;
                    local_110 = (uintptr_t)TypeUpdating::getValidLocalType(local_f0,ref_1._4_4_);
                    local_104 = Builder::addVar(pFVar6,(Type)local_110);
                    drop = (Drop *)Builder::makeLocalSet
                                             (&local_98,local_104,(Expression *)lastOperandType.id);
                    get_1 = (Expression *)Builder::makeDrop(&local_98,local_18->target);
                    local_140 = local_f0.id;
                    get_00 = Builder::makeLocalGet(&local_98,local_104,local_f0);
                    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                             ::getModule(&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                          .
                                          super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                        );
                    local_158 = TypeUpdating::fixLocalGet(get_00,pMVar2);
                    local_168 = drop;
                    local_160 = get_1;
                    local_150._M_array = (iterator)&local_168;
                    local_150._M_len = 3;
                    local_138 = local_158;
                    pBVar7 = Builder::makeBlock(&local_98,&local_150);
                    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                              back(&(local_18->operands).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  );
                    *ppEVar5 = (Expression *)pBVar7;
                    local_178 = (local_80->func).super_IString.str._M_len;
                    local_170 = (local_80->func).super_IString.str._M_str;
                    calls = (Expression *)
                            (local_18->super_SpecificExpression<(wasm::Expression::Id)56>).
                            super_Expression.type.id;
                    pCVar3 = Builder::makeCall<ArenaVector<wasm::Expression*>>
                                       (&local_98,(Name)(local_80->func).super_IString.str,
                                        &local_18->operands,(Type)calls,
                                        (bool)(local_18->isReturn & 1));
                    replaceCurrent(this,(Expression *)pCVar3);
                  }
                }
              }
            }
          }
        }
        else {
          pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          Builder::Builder(&local_58,pMVar2);
          table = (local_50->table).super_IString.str;
          pEVar4 = local_50->index;
          args = &local_18->operands;
          HStack_70 = wasm::Type::getHeapType
                                (&(local_50->super_SpecificExpression<(wasm::Expression::Id)45>).
                                  super_Expression.type);
          rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                          (&local_58,(Name)table,pEVar4,args,HStack_70,
                           (bool)(local_18->isReturn & 1));
          replaceCurrent(this,(Expression *)rep);
        }
      }
      else {
        pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
        Builder::Builder(&local_30,pMVar2);
        local_40 = (local_28->func).super_IString.str._M_len;
        local_38 = (local_28->func).super_IString.str._M_str;
        get = (TableGet *)
              (local_18->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.
              id;
        pCVar3 = Builder::makeCall<ArenaVector<wasm::Expression*>>
                           (&local_30,(Name)(local_28->func).super_IString.str,&local_18->operands,
                            (Type)get,(bool)(local_18->isReturn & 1));
        replaceCurrent(this,(Expression *)pCVar3);
      }
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = Properties::getFallthrough(
                      curr->target, getPassOptions(), *getModule())
                      ->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }